

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.hpp
# Opt level: O0

element_t __thiscall mat_lib::matrix<double>::get(matrix<double> *this,size_t row,size_t column)

{
  element_t *peVar1;
  size_t sVar2;
  logic_error *this_00;
  size_t column_local;
  size_t row_local;
  matrix<double> *this_local;
  
  sVar2 = columns(this);
  if ((column < sVar2) && (sVar2 = rows(this), row < sVar2)) {
    peVar1 = this->elements__;
    sVar2 = offset__(this,row,(int)column);
    return peVar1[sVar2];
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,"bad dimension");
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

element_t get(std::size_t row, std::size_t column) const {
          if (column >= this->columns() || row >= this->rows())
              throw logic_error("bad dimension");
          if (column < 0 || row < 0)
              throw logic_error("rows and columns must be positive integers");
          return elements__[offset__(row,column)];
      }